

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

size_t __thiscall simdjson::internal::tape_ref::after_element(tape_ref *this)

{
  size_t sVar1;
  ulong uVar2;
  uint uVar3;
  
  sVar1 = this->json_index;
  uVar2 = *(ulong *)((long)(this->doc->tape)._M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false> + sVar1 * 8);
  uVar3 = (byte)(uVar2 >> 0x38) - 0x5b;
  if (uVar3 < 0x21) {
    if ((0x4020200UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
      return sVar1 + 2;
    }
    if ((0x100000001U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
      return uVar2 & 0xffffffff;
    }
  }
  return sVar1 + 1;
}

Assistant:

simdjson_really_inline tape_type tape_ref::tape_ref_type() const noexcept {
  return static_cast<tape_type>(doc->tape[json_index] >> 56);
}